

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int is_comp_rd_match(AV1_COMP *cpi,MACROBLOCK *x,COMP_RD_STATS *st,MB_MODE_INFO *mi,
                    int32_t *comp_rate,int64_t *comp_dist,int32_t *comp_model_rate,
                    int64_t *comp_model_dist,int *comp_rs2)

{
  int iVar1;
  MB_MODE_INFO *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  int comp_type;
  int reuse_data [4];
  WarpedMotionParams *wm;
  int i;
  MACROBLOCKD *xd;
  int local_6c;
  int local_68 [6];
  long local_50;
  int local_44;
  long local_40;
  long local_38;
  long local_30;
  MB_MODE_INFO *local_28;
  long local_20;
  long local_10;
  
  if (*(uint32_t *)(in_RDX + 0x7c) != (in_RCX->interp_filters).as_int) {
    return 0;
  }
  local_40 = in_RSI + 0x1a0;
  local_44 = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  while( true ) {
    if (1 < local_44) {
      local_68[0] = 1;
      local_68[1] = 1;
      local_68[2] = 0;
      local_68[3] = 0;
      iVar1 = have_newmv_in_inter_mode(local_28->mode);
      if (((iVar1 == 0) &&
          (iVar1 = have_newmv_in_inter_mode(*(PREDICTION_MODE *)(local_20 + 0x7a)), iVar1 == 0)) ||
         (*(int *)(local_10 + 0x60af8) != 0)) {
        local_68[2] = 1;
      }
      if ((*(int *)(local_10 + 0x60b20) != 0) ||
         ((iVar1 = have_newmv_in_inter_mode(local_28->mode), iVar1 == 0 &&
          (iVar1 = have_newmv_in_inter_mode(*(PREDICTION_MODE *)(local_20 + 0x7a)), iVar1 == 0)))) {
        local_68[3] = 1;
      }
      for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
        if (local_68[local_6c] != 0) {
          *(undefined4 *)(local_30 + (long)local_6c * 4) =
               *(undefined4 *)(local_20 + (long)local_6c * 4);
          *(undefined8 *)(local_38 + (long)local_6c * 8) =
               *(undefined8 *)(local_20 + 0x10 + (long)local_6c * 8);
          *(undefined4 *)(in_stack_00000008 + (long)local_6c * 4) =
               *(undefined4 *)(local_20 + 0x30 + (long)local_6c * 4);
          *(undefined8 *)(reuse_data._0_8_ + (long)local_6c * 8) =
               *(undefined8 *)(local_20 + 0x40 + (long)local_6c * 8);
          *(undefined4 *)(reuse_data._8_8_ + (long)local_6c * 4) =
               *(undefined4 *)(local_20 + 0x60 + (long)local_6c * 4);
        }
      }
      return 1;
    }
    if ((*(char *)(local_20 + 0x78 + (long)local_44) != local_28->ref_frame[local_44]) ||
       (*(uint32_t *)(local_20 + 0x70 + (long)local_44 * 4) != local_28->mv[local_44].as_int))
    break;
    local_50 = *(long *)(local_40 + 0x29f8) + (long)local_28->ref_frame[local_44] * 0x24;
    iVar1 = is_global_mv_block(local_28,*(TransformationType *)(local_50 + 0x20));
    if (iVar1 != *(int *)(local_20 + 0x84 + (long)local_44 * 4)) {
      return 0;
    }
    local_44 = local_44 + 1;
  }
  return 0;
}

Assistant:

static inline int is_comp_rd_match(const AV1_COMP *const cpi,
                                   const MACROBLOCK *const x,
                                   const COMP_RD_STATS *st,
                                   const MB_MODE_INFO *const mi,
                                   int32_t *comp_rate, int64_t *comp_dist,
                                   int32_t *comp_model_rate,
                                   int64_t *comp_model_dist, int *comp_rs2) {
  // TODO(ranjit): Ensure that compound type search use regular filter always
  // and check if following check can be removed
  // Check if interp filter matches with previous case
  if (st->filter.as_int != mi->interp_filters.as_int) return 0;

  const MACROBLOCKD *const xd = &x->e_mbd;
  // Match MV and reference indices
  for (int i = 0; i < 2; ++i) {
    if ((st->ref_frames[i] != mi->ref_frame[i]) ||
        (st->mv[i].as_int != mi->mv[i].as_int)) {
      return 0;
    }
    const WarpedMotionParams *const wm = &xd->global_motion[mi->ref_frame[i]];
    if (is_global_mv_block(mi, wm->wmtype) != st->is_global[i]) return 0;
  }

  int reuse_data[COMPOUND_TYPES] = { 1, 1, 0, 0 };
  // For compound wedge, reuse data if newmv search is disabled when NEWMV is
  // present or if NEWMV is not present in either of the directions
  if ((!have_newmv_in_inter_mode(mi->mode) &&
       !have_newmv_in_inter_mode(st->mode)) ||
      (cpi->sf.inter_sf.disable_interinter_wedge_newmv_search))
    reuse_data[COMPOUND_WEDGE] = 1;
  // For compound diffwtd, reuse data if fast search is enabled (no newmv search
  // when NEWMV is present) or if NEWMV is not present in either of the
  // directions
  if (cpi->sf.inter_sf.enable_fast_compound_mode_search ||
      (!have_newmv_in_inter_mode(mi->mode) &&
       !have_newmv_in_inter_mode(st->mode)))
    reuse_data[COMPOUND_DIFFWTD] = 1;

  // Store the stats for the different compound types
  for (int comp_type = COMPOUND_AVERAGE; comp_type < COMPOUND_TYPES;
       comp_type++) {
    if (reuse_data[comp_type]) {
      comp_rate[comp_type] = st->rate[comp_type];
      comp_dist[comp_type] = st->dist[comp_type];
      comp_model_rate[comp_type] = st->model_rate[comp_type];
      comp_model_dist[comp_type] = st->model_dist[comp_type];
      comp_rs2[comp_type] = st->comp_rs2[comp_type];
    }
  }
  return 1;
}